

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::Prim::set_primdata<tinyusdz::Model>(Prim *this,Model *prim)

{
  allocator local_111;
  string local_110;
  Path local_f0;
  
  linb::any::operator=(&(this->_data).v_,prim);
  ::std::__cxx11::string::string((string *)&local_110,"",&local_111);
  Path::Path(&local_f0,&prim->name,&local_110);
  Path::operator=(&this->_elementPath,&local_f0);
  Path::~Path(&local_f0);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void set_primdata(const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    // Use prim.name for elementName
    _elementPath = Path(prim.name, "");
  }